

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  int iVar5;
  size_t sVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  size_t err_code;
  undefined1 auVar8 [16];
  
  iVar5 = 0x1bb4554;
  sVar6 = ZSTD_buildSeqStore(zc,src,srcSize);
  if (0xffffffffffffff88 < sVar6) {
    return sVar6;
  }
  iVar3 = (zc->seqCollector).collectSequences;
  if (sVar6 == 1) {
    if (iVar3 != 0) {
      return 0xffffffffffffff96;
    }
    sVar6 = 0;
  }
  else {
    pZVar4 = (zc->blockState).prevCBlock;
    if (iVar3 != 0) {
      sVar6 = ZSTD_copyBlockSequences(&zc->seqCollector,&zc->seqStore,pZVar4->rep);
      if (0xffffffffffffff88 < sVar6) {
        return sVar6;
      }
      uVar1 = (zc->blockState).prevCBlock;
      uVar2 = (zc->blockState).nextCBlock;
      auVar8._8_4_ = (int)uVar1;
      auVar8._0_8_ = uVar2;
      auVar8._12_4_ = (int)((ulong)uVar1 >> 0x20);
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar2;
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar8._8_8_;
      return 0;
    }
    sVar6 = ZSTD_entropyCompressSeqStore
                      (&zc->seqStore,&pZVar4->entropy,&((zc->blockState).nextCBlock)->entropy,
                       &zc->appliedParams,dst,dstCapacity,srcSize,zc->entropyWorkspace,
                       (ulong)(uint)zc->bmi2,iVar5);
    if ((((frame == 0) || (0x18 < sVar6)) || (zc->isFirstBlock != 0)) ||
       (iVar5 = ZSTD_isRLE((BYTE *)src,srcSize), iVar5 == 0)) {
      if (sVar6 - 2 < 0xffffffffffffff87) {
        pZVar4 = (zc->blockState).prevCBlock;
        pZVar7 = (zc->blockState).nextCBlock;
        (zc->blockState).prevCBlock = pZVar7;
        (zc->blockState).nextCBlock = pZVar4;
        goto LAB_01bb4673;
      }
    }
    else {
      *(undefined1 *)dst = *src;
      sVar6 = 1;
    }
  }
  pZVar7 = (zc->blockState).prevCBlock;
LAB_01bb4673:
  if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return sVar6;
}

Assistant:

static size_t
ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                            void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize, U32 frame)
{
    /* This is an estimated upper bound for the length of an rle block.
     * This isn't the actual upper bound.
     * Finding the real threshold needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) {
            RETURN_ERROR_IF(zc->seqCollector.collectSequences, sequenceProducer_failed, "Uncompressible block");
            cSize = 0;
            goto out;
        }
    }

    if (zc->seqCollector.collectSequences) {
        FORWARD_IF_ERROR(ZSTD_copyBlockSequences(&zc->seqCollector, ZSTD_getSeqStore(zc), zc->blockState.prevCBlock->rep), "copyBlockSequences failed");
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}